

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O0

void kf_work(kiss_fft_cpx *Fout,kiss_fft_cpx *f,size_t fstride,int in_stride,int *factors,
            kiss_fft_cfg st)

{
  int p_00;
  int m_00;
  kiss_fft_cpx *Fout_end;
  int m;
  int p;
  kiss_fft_cpx *Fout_beg;
  kiss_fft_cfg st_local;
  int *factors_local;
  int in_stride_local;
  size_t fstride_local;
  kiss_fft_cpx *f_local;
  kiss_fft_cpx *Fout_local;
  
  p_00 = *factors;
  m_00 = factors[1];
  fstride_local = (size_t)f;
  f_local = Fout;
  if (m_00 == 1) {
    do {
      *f_local = *(kiss_fft_cpx *)fstride_local;
      fstride_local = fstride * (long)in_stride * 8 + fstride_local;
      f_local = f_local + 1;
    } while (f_local != Fout + p_00 * m_00);
  }
  else {
    do {
      kf_work(f_local,(kiss_fft_cpx *)fstride_local,fstride * (long)p_00,in_stride,factors + 2,st);
      fstride_local = fstride * (long)in_stride * 8 + fstride_local;
      f_local = f_local + m_00;
    } while (f_local != Fout + p_00 * m_00);
  }
  switch(p_00) {
  case 2:
    kf_bfly2(Fout,fstride,st,m_00);
    break;
  case 3:
    kf_bfly3(Fout,fstride,st,(long)m_00);
    break;
  case 4:
    kf_bfly4(Fout,fstride,st,(long)m_00);
    break;
  case 5:
    kf_bfly5(Fout,fstride,st,m_00);
    break;
  default:
    kf_bfly_generic(Fout,fstride,st,m_00,p_00);
  }
  return;
}

Assistant:

static
void kf_work(
        kiss_fft_cpx * Fout,
        const kiss_fft_cpx * f,
        const size_t fstride,
        int in_stride,
        int * factors,
        const kiss_fft_cfg st
        )
{
    kiss_fft_cpx * Fout_beg=Fout;
    const int p=*factors++; /* the radix  */
    const int m=*factors++; /* stage's fft length/p */
    const kiss_fft_cpx * Fout_end = Fout + p*m;

#ifdef _OPENMP
    // use openmp extensions at the 
    // top-level (not recursive)
    if (fstride==1 && p<=5)
    {
        int k;

        // execute the p different work units in different threads
#       pragma omp parallel for
        for (k=0;k<p;++k) 
            kf_work( Fout +k*m, f+ fstride*in_stride*k,fstride*p,in_stride,factors,st);
        // all threads have joined by this point

        switch (p) {
            case 2: kf_bfly2(Fout,fstride,st,m); break;
            case 3: kf_bfly3(Fout,fstride,st,m); break; 
            case 4: kf_bfly4(Fout,fstride,st,m); break;
            case 5: kf_bfly5(Fout,fstride,st,m); break; 
            default: kf_bfly_generic(Fout,fstride,st,m,p); break;
        }
        return;
    }
#endif

    if (m==1) {
        do{
            *Fout = *f;
            f += fstride*in_stride;
        }while(++Fout != Fout_end );
    }else{
        do{
            // recursive call:
            // DFT of size m*p performed by doing
            // p instances of smaller DFTs of size m, 
            // each one takes a decimated version of the input
            kf_work( Fout , f, fstride*p, in_stride, factors,st);
            f += fstride*in_stride;
        }while( (Fout += m) != Fout_end );
    }

    Fout=Fout_beg;

    // recombine the p smaller DFTs 
    switch (p) {
        case 2: kf_bfly2(Fout,fstride,st,m); break;
        case 3: kf_bfly3(Fout,fstride,st,m); break; 
        case 4: kf_bfly4(Fout,fstride,st,m); break;
        case 5: kf_bfly5(Fout,fstride,st,m); break; 
        default: kf_bfly_generic(Fout,fstride,st,m,p); break;
    }
}